

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_huff(deflate_state *s,int flush)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  Bytef *pBVar4;
  
  while ((s->lookahead != 0 || (fill_window(s), s->lookahead != 0))) {
    s->match_length = 0;
    bVar1 = s->window[s->strstart];
    uVar3 = s->last_lit;
    s->d_buf[uVar3] = 0;
    s->last_lit = uVar3 + 1;
    s->l_buf[uVar3] = bVar1;
    s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
    s->lookahead = s->lookahead - 1;
    uVar3 = s->strstart + 1;
    s->strstart = uVar3;
    if (s->last_lit == s->lit_bufsize - 1) {
      uVar2 = s->block_start;
      if ((long)uVar2 < 0) {
        pBVar4 = (Bytef *)0x0;
      }
      else {
        pBVar4 = s->window + (uVar2 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar4,uVar3 - uVar2,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  }
  if (flush == 0) {
    return need_more;
  }
  uVar2 = s->block_start;
  if ((long)uVar2 < 0) {
    pBVar4 = (Bytef *)0x0;
  }
  else {
    pBVar4 = s->window + (uVar2 & 0xffffffff);
  }
  _tr_flush_block(s,(charf *)pBVar4,s->strstart - uVar2,(uint)(flush == 4));
  s->block_start = (ulong)s->strstart;
  flush_pending(s->strm);
  if (s->strm->avail_out != 0) {
    return (uint)(flush == 4) * 2 + block_done;
  }
  return (uint)(flush == 4) * 2;
}

Assistant:

local block_state deflate_huff(deflate_state *s, int flush)
{
    int bflush;             /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we have a literal to write. */
        if (s->lookahead == 0) {
            fill_window(s);
            if (s->lookahead == 0) {
                if (flush == Z_NO_FLUSH)
                    return need_more;
                break;      /* flush the current block */
            }
        }

        /* Output a literal byte */
        s->match_length = 0;
        Tracevv((stderr,"%c", s->window[s->strstart]));
        _tr_tally_lit (s, s->window[s->strstart], bflush);
        s->lookahead--;
        s->strstart++;
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}